

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O0

string * __thiscall
tinyusdz::value::print_strided_array_snipped<std::array<unsigned_char,2ul>>
          (string *__return_storage_ptr__,value *this,uint8_t *vals,size_t stride_bytes,size_t n,
          size_t N)

{
  unsigned_long *puVar1;
  unsigned_long local_1f0;
  size_t i_2;
  size_t i_1;
  unsigned_long local_1d8;
  size_t tail_start;
  size_t head_end;
  size_t i;
  stringstream local_1b8 [8];
  stringstream os;
  ostream aoStack_1a8 [376];
  size_t local_30;
  size_t N_local;
  size_t n_local;
  size_t stride_bytes_local;
  uint8_t *vals_local;
  
  local_30 = n;
  N_local = stride_bytes;
  n_local = (size_t)vals;
  stride_bytes_local = (size_t)this;
  vals_local = (uint8_t *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((n_local == 0) || (n_local == 2)) {
    print_array_snipped<std::array<unsigned_char,2ul>>
              (__return_storage_ptr__,(value *)stride_bytes_local,
               (array<unsigned_char,_2UL> *)N_local,local_30,n);
  }
  else {
    if ((local_30 == 0) || (N_local <= local_30 << 1)) {
      ::std::operator<<(aoStack_1a8,"[");
      for (head_end = 0; head_end < N_local; head_end = head_end + 1) {
        if (head_end != 0) {
          ::std::operator<<(aoStack_1a8,", ");
        }
        ::std::operator<<(aoStack_1a8,(uchar2 *)(stride_bytes_local + head_end * n_local));
      }
      ::std::operator<<(aoStack_1a8,"]");
    }
    else {
      puVar1 = ::std::min<unsigned_long>(&local_30,&N_local);
      tail_start = *puVar1;
      i_1 = N_local - local_30;
      puVar1 = std::max<unsigned_long>(&i_1,&tail_start);
      local_1d8 = *puVar1;
      ::std::operator<<(aoStack_1a8,"[");
      for (i_2 = 0; i_2 < tail_start; i_2 = i_2 + 1) {
        if (i_2 != 0) {
          ::std::operator<<(aoStack_1a8,", ");
        }
        ::std::operator<<(aoStack_1a8,(uchar2 *)(stride_bytes_local + i_2 * n_local));
      }
      ::std::operator<<(aoStack_1a8,", ..., ");
      for (local_1f0 = local_1d8; local_1f0 < N_local; local_1f0 = local_1f0 + 1) {
        if (local_1d8 < local_1f0) {
          ::std::operator<<(aoStack_1a8,", ");
        }
        ::std::operator<<(aoStack_1a8,(uchar2 *)(stride_bytes_local + local_1f0 * n_local));
      }
      ::std::operator<<(aoStack_1a8,"]");
    }
    ::std::__cxx11::stringstream::str();
  }
  i._4_4_ = 1;
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_strided_array_snipped(const uint8_t *vals, size_t stride_bytes, const size_t n, size_t N = 16) {
  std::stringstream os;

  if ((stride_bytes == 0) || (stride_bytes == sizeof(T))) { // tightly packed.
    return print_array_snipped(reinterpret_cast<const T*>(vals), n, N);
  }

  if ((N == 0) || ((N * 2) >= n)) {
    os << "[";
    for (size_t i = 0; i < n; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, n);
    size_t tail_start = (std::max)(n - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < n; i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }

    os << "]";
  }
  return os.str();
}